

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::UpdateWitnessStackTxInRequest::UpdateWitnessStackTxInRequest
          (UpdateWitnessStackTxInRequest *this)

{
  allocator local_11;
  UpdateWitnessStackTxInRequest *local_10;
  UpdateWitnessStackTxInRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::UpdateWitnessStackTxInRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::UpdateWitnessStackTxInRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::UpdateWitnessStackTxInRequest>)._vptr_JsonClassBase
       = (_func_int **)&PTR__UpdateWitnessStackTxInRequest_01b41e48;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->txid_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->vout_ = 0;
  WitnessStackData::WitnessStackData(&this->witness_stack_);
  CollectFieldName();
  return;
}

Assistant:

UpdateWitnessStackTxInRequest() {
    CollectFieldName();
  }